

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

Symbol * sym_AddAnonLabel(void)

{
  Symbol *pSVar1;
  char name [256];
  char acStack_108 [256];
  
  if (anonLabelID == 0xffffffff) {
    pSVar1 = (Symbol *)0x0;
    error("Only %u anonymous labels can be created!",0xffffffff);
  }
  else {
    sym_WriteAnonLabelName(acStack_108,0,true);
    anonLabelID = anonLabelID + 1;
    pSVar1 = addLabel(acStack_108);
  }
  return pSVar1;
}

Assistant:

struct Symbol *sym_AddAnonLabel(void)
{
	if (anonLabelID == UINT32_MAX) {
		error("Only %" PRIu32 " anonymous labels can be created!", anonLabelID);
		return NULL;
	}
	char name[MAXSYMLEN + 1];

	sym_WriteAnonLabelName(name, 0, true); // The direction is important!
	anonLabelID++;
	return addLabel(name);
}